

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender __thiscall
fmt::v9::detail::digit_grouping<char>::apply<fmt::v9::appender,char>
          (digit_grouping<char> *this,appender out,basic_string_view<char> digits)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  int i;
  basic_memory_buffer<int,_500UL,_std::allocator<int>_> separators;
  int local_844;
  char *local_840;
  next_state local_838;
  basic_memory_buffer<int,_500UL,_std::allocator<int>_> local_828;
  
  uVar1 = digits.size_;
  local_840 = digits.data_;
  local_828.super_buffer<int>.ptr_ = local_828.store_;
  local_828.super_buffer<int>.size_ = 0;
  local_828.super_buffer<int>._vptr_buffer = (_func_int **)&PTR_grow_001d71c0;
  local_828.super_buffer<int>.capacity_ = 500;
  local_838.group._M_current = local_838.group._M_current & 0xffffffff00000000;
  buffer<int>::push_back(&local_828.super_buffer<int>,(int *)&local_838);
  local_838.group._M_current = (this->sep_).grouping._M_dataplus._M_p;
  local_838.pos = 0;
  while( true ) {
    local_844 = next(this,&local_838);
    if ((local_844 == 0) || ((int)digits.size_ <= local_844)) break;
    buffer<int>::push_back(&local_828.super_buffer<int>,&local_844);
  }
  iVar2 = (int)local_828.super_buffer<int>.size_ + -1;
  uVar4 = 0;
  uVar3 = 0;
  if (0 < (int)digits.size_) {
    uVar3 = uVar1 & 0xffffffff;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    if ((int)uVar1 == local_828.super_buffer<int>.ptr_[iVar2]) {
      local_844 = CONCAT31(local_844._1_3_,(this->sep_).thousands_sep);
      buffer<char>::push_back
                ((buffer<char> *)
                 out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container,
                 (char *)&local_844);
      iVar2 = iVar2 + -1;
    }
    local_844 = CONCAT31(local_844._1_3_,local_840[uVar4]);
    buffer<char>::push_back
              ((buffer<char> *)
               out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container,
               (char *)&local_844);
    uVar1 = (ulong)((int)uVar1 - 1);
  }
  basic_memory_buffer<int,_500UL,_std::allocator<int>_>::deallocate(&local_828);
  return (appender)
         out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
}

Assistant:

Out apply(Out out, basic_string_view<C> digits) const {
    auto num_digits = static_cast<int>(digits.size());
    auto separators = basic_memory_buffer<int>();
    separators.push_back(0);
    auto state = initial_state();
    while (int i = next(state)) {
      if (i >= num_digits) break;
      separators.push_back(i);
    }
    for (int i = 0, sep_index = static_cast<int>(separators.size() - 1);
         i < num_digits; ++i) {
      if (num_digits - i == separators[sep_index]) {
        *out++ = separator();
        --sep_index;
      }
      *out++ = static_cast<Char>(digits[to_unsigned(i)]);
    }
    return out;
  }